

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5FmaAccuracy.cpp
# Opt level: O2

IterateResult __thiscall glcts::GPUShader5FmaAccuracyTest::iterate(GPUShader5FmaAccuracyTest *this)

{
  TestContext **ppTVar1;
  ostringstream *poVar2;
  TestLog *pTVar3;
  bool bVar4;
  pointer __n;
  size_t __n_00;
  GLuint i_1;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  long lVar5;
  float fVar6;
  float fVar7;
  allocator<char> local_262;
  allocator<char> local_261;
  float local_260;
  float local_25c;
  string local_258;
  string local_238;
  vector<float,_std::allocator<float>_> results_of_float_pass;
  vector<float,_std::allocator<float>_> relative_errors_for_float_pass;
  vector<float,_std::allocator<float>_> results_of_fma_pass;
  vector<float,_std::allocator<float>_> relative_errors_for_fma_pass;
  undefined1 local_198 [384];
  
  initTest(this);
  results_of_float_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results_of_float_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  results_of_float_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results_of_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results_of_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  results_of_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize(&results_of_fma_pass,10);
  std::vector<float,_std::allocator<float>_>::resize(&results_of_float_pass,10);
  executePass(this,this->m_program_object_id_for_fma_pass,
              results_of_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start);
  executePass(this,this->m_program_object_id_for_float_pass,
              results_of_float_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start);
  relative_errors_for_float_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  relative_errors_for_float_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  relative_errors_for_float_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  relative_errors_for_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  relative_errors_for_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  relative_errors_for_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize(&relative_errors_for_fma_pass,10);
  std::vector<float,_std::allocator<float>_>::resize(&relative_errors_for_float_pass,10);
  for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
    fVar6 = 2.71828 - results_of_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5];
    fVar7 = -fVar6;
    if (-fVar6 <= fVar6) {
      fVar7 = fVar6;
    }
    relative_errors_for_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[lVar5] = fVar7 / 2.71828;
    fVar6 = 2.71828 - results_of_float_pass.super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar5];
    fVar7 = -fVar6;
    if (-fVar6 <= fVar6) {
      fVar7 = fVar6;
    }
    relative_errors_for_float_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[lVar5] = fVar7 / 2.71828;
  }
  local_260 = 0.0;
  local_25c = 0.0;
  for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
    local_260 = local_260 +
                relative_errors_for_fma_pass.super__Vector_base<float,_std::allocator<float>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar5];
    local_25c = local_25c +
                relative_errors_for_float_pass.super__Vector_base<float,_std::allocator<float>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar5];
  }
  bVar4 = local_260 <= local_25c;
  if (bVar4) {
    description = "Pass";
  }
  else {
    local_198._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_198 + 8);
    __n = relative_errors_for_float_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Routine fma has lower accuracy than a * b + c !");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    ppTVar1 = &(this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    pTVar3 = (*ppTVar1)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"Sum of relative error",&local_261);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,fixed_sample_locations_values + 1,&local_262);
    tcu::LogSection::LogSection((LogSection *)local_198,&local_238,&local_258);
    tcu::LogSection::write((LogSection *)local_198,(int)pTVar3,__buf,(size_t)__n);
    tcu::LogSection::~LogSection((LogSection *)local_198);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_238);
    local_198._0_8_ = (*ppTVar1)->m_log;
    poVar2 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"fma       ");
    std::ostream::operator<<(poVar2,local_260);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    local_198._0_8_ = (*ppTVar1)->m_log;
    poVar2 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"a * b + c ");
    std::ostream::operator<<(poVar2,local_25c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    tcu::TestLog::endSection((*ppTVar1)->m_log);
    pTVar3 = (*ppTVar1)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"Relative errors",&local_261);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,fixed_sample_locations_values + 1,&local_262);
    tcu::LogSection::LogSection((LogSection *)local_198,&local_238,&local_258);
    tcu::LogSection::write((LogSection *)local_198,(int)pTVar3,__buf_00,(size_t)__n);
    tcu::LogSection::~LogSection((LogSection *)local_198);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_238);
    logArray(this,"fma",
             relative_errors_for_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,10);
    __n_00 = 10;
    logArray(this,"a * b + c",
             relative_errors_for_float_pass.super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_start,10);
    tcu::TestLog::endSection((*ppTVar1)->m_log);
    pTVar3 = (*ppTVar1)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"Results",&local_261);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,fixed_sample_locations_values + 1,&local_262);
    tcu::LogSection::LogSection((LogSection *)local_198,&local_238,&local_258);
    tcu::LogSection::write((LogSection *)local_198,(int)pTVar3,__buf_01,__n_00);
    tcu::LogSection::~LogSection((LogSection *)local_198);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_238);
    logArray(this,"fma",
             results_of_fma_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,10);
    logArray(this,"a * b + c",
             results_of_float_pass.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,10);
    tcu::TestLog::endSection((*ppTVar1)->m_log);
    description = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar4,
             description);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&relative_errors_for_fma_pass.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&relative_errors_for_float_pass.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&results_of_fma_pass.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&results_of_float_pass.super__Vector_base<float,_std::allocator<float>_>);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GPUShader5FmaAccuracyTest::iterate()
{
	initTest();

	/* Storage space for result values */
	std::vector<glw::GLfloat> results_of_float_pass;
	std::vector<glw::GLfloat> results_of_fma_pass;

	results_of_fma_pass.resize(m_n_draw_call_executions);
	results_of_float_pass.resize(m_n_draw_call_executions);

	/* Execute fma pass */
	executePass(m_program_object_id_for_fma_pass, &results_of_fma_pass[0]);

	/* Execute float pass */
	executePass(m_program_object_id_for_float_pass, &results_of_float_pass[0]);

	/* Storage space for relative errors */
	std::vector<glw::GLfloat> relative_errors_for_float_pass;
	std::vector<glw::GLfloat> relative_errors_for_fma_pass;

	relative_errors_for_fma_pass.resize(m_n_draw_call_executions);
	relative_errors_for_float_pass.resize(m_n_draw_call_executions);

	/* Calculate relative errors */
	for (glw::GLuint i = 0; i < m_n_draw_call_executions; ++i)
	{
		calculateRelativeError(results_of_fma_pass[i], m_expected_result, relative_errors_for_fma_pass[i]);
		calculateRelativeError(results_of_float_pass[i], m_expected_result, relative_errors_for_float_pass[i]);
	}

	/* Sum relative errors */
	glw::GLfloat relative_error_sum_for_fma_pass   = 0.0f;
	glw::GLfloat relative_error_sum_for_float_pass = 0.0f;

	for (glw::GLuint i = 0; i < m_n_draw_call_executions; ++i)
	{
		relative_error_sum_for_fma_pass += relative_errors_for_fma_pass[i];
		relative_error_sum_for_float_pass += relative_errors_for_float_pass[i];
	}

	if (relative_error_sum_for_fma_pass <= relative_error_sum_for_float_pass)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Routine fma has lower accuracy than a * b + c !"
						   << tcu::TestLog::EndMessage;

		/* Log sum of relative errors */
		m_testCtx.getLog() << tcu::TestLog::Section("Sum of relative error", "");
		m_testCtx.getLog() << tcu::TestLog::Message << "fma       " << relative_error_sum_for_fma_pass
						   << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "a * b + c " << relative_error_sum_for_float_pass
						   << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::EndSection;

		/* Log relative errors */
		m_testCtx.getLog() << tcu::TestLog::Section("Relative errors", "");
		logArray("fma", &relative_errors_for_fma_pass[0], m_n_draw_call_executions);
		logArray("a * b + c", &relative_errors_for_float_pass[0], m_n_draw_call_executions);
		m_testCtx.getLog() << tcu::TestLog::EndSection;

		/* Log results */
		m_testCtx.getLog() << tcu::TestLog::Section("Results", "");
		logArray("fma", &results_of_fma_pass[0], m_n_draw_call_executions);
		logArray("a * b + c", &results_of_float_pass[0], m_n_draw_call_executions);
		m_testCtx.getLog() << tcu::TestLog::EndSection;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}